

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
emplace_helper<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  piter pVar1;
  Node<QStringView,_QXmlStreamReaderPrivate::Entity> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
  findOrInsert<QStringView>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this,key);
  n = (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *)
      ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).data +
      (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f] * 0x48);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QStringView,QXmlStreamReaderPrivate::Entity>::
    createInPlace<QXmlStreamReaderPrivate::Entity_const&>(n,key,args);
  }
  else {
    QHashPrivate::Node<QStringView,QXmlStreamReaderPrivate::Entity>::
    emplaceValue<QXmlStreamReaderPrivate::Entity_const&>
              ((Node<QStringView,QXmlStreamReaderPrivate::Entity> *)n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }